

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall
QWizard::setDefaultProperty(QWizard *this,char *className,char *property,char *changedSignal)

{
  QArrayDataPointer<QWizardDefaultProperty> *this_00;
  long lVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QWizardDefaultProperty local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  this_00 = (QArrayDataPointer<QWizardDefaultProperty> *)(lVar1 + 0x308);
  uVar4 = *(uint *)(lVar1 + 0x318);
  do {
    uVar4 = uVar4 - 1;
    if ((int)uVar4 < 0) goto LAB_0051825f;
    pcVar3 = *(char **)(*(long *)(lVar1 + 0x310) + 8 + (ulong)(uVar4 & 0x7fffffff) * 0x48);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    iVar2 = qstrcmp(pcVar3,className);
  } while (iVar2 != 0);
  if ((*(int **)(lVar1 + 0x308) == (int *)0x0) || (1 < **(int **)(lVar1 + 0x308))) {
    QArrayDataPointer<QWizardDefaultProperty>::reallocateAndGrow
              (this_00,GrowsAtEnd,0,(QArrayDataPointer<QWizardDefaultProperty> *)0x0);
  }
  QtPrivate::QMovableArrayOps<QWizardDefaultProperty>::erase
            ((QMovableArrayOps<QWizardDefaultProperty> *)this_00,
             (QWizardDefaultProperty *)
             ((ulong)(uVar4 & 0x7fffffff) * 0x48 + *(long *)(lVar1 + 0x310)),1);
LAB_0051825f:
  QByteArray::QByteArray(&local_80.className,className,-1);
  QByteArray::QByteArray(&local_80.property,property,-1);
  QByteArray::QByteArray(&local_80.changedSignal,changedSignal,-1);
  QtPrivate::QMovableArrayOps<QWizardDefaultProperty>::emplace<QWizardDefaultProperty>
            ((QMovableArrayOps<QWizardDefaultProperty> *)this_00,*(qsizetype *)(lVar1 + 0x318),
             &local_80);
  QList<QWizardDefaultProperty>::end((QList<QWizardDefaultProperty> *)this_00);
  if (&(local_80.changedSignal.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.changedSignal.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.changedSignal.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_80.changedSignal.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_80.changedSignal.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_80.property.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.property.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.property.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_80.property.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_80.property.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_80.className.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_80.className.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_80.className.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setDefaultProperty(const char *className, const char *property,
                                 const char *changedSignal)
{
    Q_D(QWizard);
    for (int i = d->defaultPropertyTable.size() - 1; i >= 0; --i) {
        if (qstrcmp(d->defaultPropertyTable.at(i).className, className) == 0) {
            d->defaultPropertyTable.remove(i);
            break;
        }
    }
    d->defaultPropertyTable.append(QWizardDefaultProperty(className, property, changedSignal));
}